

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O3

void __thiscall Fl_JPEG_Image::Fl_JPEG_Image(Fl_JPEG_Image *this,char *filename)

{
  int iVar1;
  FILE *__stream;
  uchar *puVar2;
  ulong uVar3;
  JSAMPROW row;
  jpeg_decompress_struct dinfo;
  fl_jpeg_error_mgr jerr;
  uchar *local_430;
  undefined8 local_428 [8];
  undefined4 local_3e8;
  undefined4 local_3bc;
  int local_3a0;
  uint local_39c;
  undefined8 local_398;
  uint local_380;
  code *local_198 [2];
  code *local_188;
  __jmp_buf_tag local_f0;
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027bb18;
  (this->super_Fl_RGB_Image).alloc_array = 0;
  (this->super_Fl_RGB_Image).array = (uchar *)0x0;
  __stream = (FILE *)fl_fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
  }
  else {
    local_428[0] = jpeg_std_error(local_198);
    local_198[0] = fl_jpeg_error_handler;
    local_188 = fl_jpeg_output_handler;
    iVar1 = _setjmp(&local_f0);
    if (iVar1 == 0) {
      jpeg_CreateDecompress(local_428,0x50,0x290);
      jpeg_stdio_src(local_428,__stream);
      jpeg_read_header(local_428,1);
      local_3bc = 0;
      local_3e8 = 2;
      local_398 = 0x300000003;
      jpeg_calc_output_dimensions();
      (this->super_Fl_RGB_Image).super_Fl_Image.w_ = local_3a0;
      (this->super_Fl_RGB_Image).super_Fl_Image.h_ = local_39c;
      uVar3 = (long)(int)local_39c * (long)local_3a0 * (long)local_398._4_4_;
      (this->super_Fl_RGB_Image).super_Fl_Image.d_ = local_398._4_4_;
      if (Fl_RGB_Image::max_size_ <= uVar3 && uVar3 - Fl_RGB_Image::max_size_ != 0) {
        longjmp(&local_f0,1);
      }
      puVar2 = (uchar *)operator_new__((long)(int)(local_39c * local_3a0 * local_398._4_4_));
      (this->super_Fl_RGB_Image).array = puVar2;
      (this->super_Fl_RGB_Image).alloc_array = 1;
      jpeg_start_decompress(local_428);
      while (local_380 < local_39c) {
        local_430 = (this->super_Fl_RGB_Image).array + local_380 * local_3a0 * local_398._4_4_;
        jpeg_read_scanlines(local_428,&local_430,1);
      }
      jpeg_finish_decompress(local_428);
      jpeg_destroy_decompress(local_428);
      fclose(__stream);
    }
    else {
      (*Fl::warning)("JPEG file \"%s\" is too large or contains errors!\n",filename);
      if ((this->super_Fl_RGB_Image).array != (uchar *)0x0) {
        jpeg_finish_decompress(local_428);
      }
      jpeg_destroy_decompress(local_428);
      fclose(__stream);
      (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
      (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
      (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
      puVar2 = (this->super_Fl_RGB_Image).array;
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
        (this->super_Fl_RGB_Image).array = (uchar *)0x0;
        (this->super_Fl_RGB_Image).alloc_array = 0;
      }
      (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
    }
  }
  return;
}

Assistant:

Fl_JPEG_Image::Fl_JPEG_Image(const char *filename)	// I - File to load
: Fl_RGB_Image(0,0,0) {
#ifdef HAVE_LIBJPEG
  FILE				*fp;	// File pointer
  jpeg_decompress_struct	dinfo;	// Decompressor info
  fl_jpeg_error_mgr		jerr;	// Error handler info
  JSAMPROW			row;	// Sample row pointer
  
  // the following variables are pointers allocating some private space that
  // is not reset by 'setjmp()'
  char* max_finish_decompress_err;      // count errors and give up afer a while
  char* max_destroy_decompress_err;     // to avoid recusion and deadlock
  
  // Clear data...
  alloc_array = 0;
  array = (uchar *)0;
  
  // Open the image file...
  if ((fp = fl_fopen(filename, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }
  
  // Setup the decompressor info and read the header...
  dinfo.err                = jpeg_std_error((jpeg_error_mgr *)&jerr);
  jerr.pub_.error_exit     = fl_jpeg_error_handler;
  jerr.pub_.output_message = fl_jpeg_output_handler;
  
  // Setup error loop variables
  max_finish_decompress_err = (char*)malloc(1);   // allocate space on the frame for error counters
  max_destroy_decompress_err = (char*)malloc(1);  // otherwise, the variables are reset on the longjmp
  *max_finish_decompress_err=10;
  *max_destroy_decompress_err=10;
  
  if (setjmp(jerr.errhand_))
  {
    // JPEG error handling...
    Fl::warning("JPEG file \"%s\" is too large or contains errors!\n", filename);
    // if any of the cleanup routines hits another error, we would end up 
    // in a loop. So instead, we decrement max_err for some upper cleanup limit.
    if ( ((*max_finish_decompress_err)-- > 0) && array)
      jpeg_finish_decompress(&dinfo);
    if ( (*max_destroy_decompress_err)-- > 0)
      jpeg_destroy_decompress(&dinfo);
    
    fclose(fp);
    
    w(0);
    h(0);
    d(0);
    
    if (array) {
      delete[] (uchar *)array;
      array = 0;
      alloc_array = 0;
    }
    
    free(max_destroy_decompress_err);
    free(max_finish_decompress_err);
    
    ld(ERR_FORMAT);
    return;
  }
  
  jpeg_create_decompress(&dinfo);
  jpeg_stdio_src(&dinfo, fp);
  jpeg_read_header(&dinfo, TRUE);
  
  dinfo.quantize_colors      = (boolean)FALSE;
  dinfo.out_color_space      = JCS_RGB;
  dinfo.out_color_components = 3;
  dinfo.output_components    = 3;
  
  jpeg_calc_output_dimensions(&dinfo);
  
  w(dinfo.output_width); 
  h(dinfo.output_height);
  d(dinfo.output_components);
  
  if (((size_t)w()) * h() * d() > max_size() ) longjmp(jerr.errhand_, 1);
  array = new uchar[w() * h() * d()];
  alloc_array = 1;
  
  jpeg_start_decompress(&dinfo);
  
  while (dinfo.output_scanline < dinfo.output_height) {
    row = (JSAMPROW)(array +
                     dinfo.output_scanline * dinfo.output_width *
                     dinfo.output_components);
    jpeg_read_scanlines(&dinfo, &row, (JDIMENSION)1);
  }
  
  jpeg_finish_decompress(&dinfo);
  jpeg_destroy_decompress(&dinfo);
  
  free(max_destroy_decompress_err);
  free(max_finish_decompress_err);
  
  fclose(fp);
#endif // HAVE_LIBJPEG
}